

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConstraintPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintPrototypeSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::TokenList_const&,slang::parsing::Token&,slang::syntax::NameSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          TokenList *args_1,Token *args_2,NameSyntax *args_3,Token *args_4)

{
  Token keyword;
  Token semi;
  ConstraintPrototypeSyntax *this_00;
  
  this_00 = (ConstraintPrototypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConstraintPrototypeSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ConstraintPrototypeSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  keyword.kind = args_2->kind;
  keyword._2_1_ = args_2->field_0x2;
  keyword.numFlags.raw = (args_2->numFlags).raw;
  keyword.rawLen = args_2->rawLen;
  keyword.info = args_2->info;
  semi.kind = args_4->kind;
  semi._2_1_ = args_4->field_0x2;
  semi.numFlags.raw = (args_4->numFlags).raw;
  semi.rawLen = args_4->rawLen;
  semi.info = args_4->info;
  slang::syntax::ConstraintPrototypeSyntax::ConstraintPrototypeSyntax
            (this_00,args,args_1,keyword,args_3,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }